

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O1

MPP_RET mpg4d_parse_matrix(BitReadCtx_t *gb,RK_U8 *matrix)

{
  int iVar1;
  MPP_RET MVar2;
  void *pvVar3;
  int __c;
  void *pvVar4;
  RK_S32 _out;
  int local_2c;
  
  pvVar3 = (void *)0x0;
  iVar1 = 0;
  do {
    __c = iVar1;
    pvVar4 = pvVar3;
    MVar2 = mpp_read_bits(gb,8,&local_2c);
    pvVar3 = (void *)(ulong)(uint)MVar2;
    gb->ret = MVar2;
    if (MVar2 != MPP_OK) goto LAB_001afab7;
    pvVar3 = (void *)((long)pvVar4 + 1);
    matrix[(long)pvVar4] = (RK_U8)local_2c;
  } while ((local_2c != 0) && (iVar1 = local_2c, pvVar4 < (void *)0x3f));
  if (pvVar4 < (void *)0x40 && local_2c == 0) {
    pvVar3 = memset(matrix + (long)pvVar3 + -1,__c,0x41 - (long)pvVar3);
  }
LAB_001afab7:
  return (MPP_RET)pvVar3;
}

Assistant:

static MPP_RET mpg4d_parse_matrix(BitReadCtx_t *gb, RK_U8 * matrix)
{
    RK_S32 i = 0;
    RK_S32 last, value = 0;

    do {
        last = value;
        READ_BITS(gb, 8, &value);
        matrix[i++] = value;
    } while (value != 0 && i < 64);

    if (value != 0)
        return MPP_ERR_STREAM;

    i--;

    while (i < 64) {
        matrix[i++ ] = last;
    }

    return MPP_OK;

__BITREAD_ERR:
    return MPP_ERR_STREAM;
}